

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O0

void emitter_init(emitter_t *emitter,emitter_output_t emitter_output,write_cb_t *write_cb,
                 void *cbopaque)

{
  void *cbopaque_local;
  write_cb_t *write_cb_local;
  emitter_output_t emitter_output_local;
  emitter_t *emitter_local;
  
  emitter->output = emitter_output;
  emitter->write_cb = write_cb;
  emitter->cbopaque = cbopaque;
  emitter->item_at_depth = false;
  emitter->emitted_key = false;
  emitter->nesting_depth = 0;
  return;
}

Assistant:

static inline void
emitter_init(emitter_t *emitter, emitter_output_t emitter_output,
    write_cb_t *write_cb, void *cbopaque) {
	emitter->output = emitter_output;
	emitter->write_cb = write_cb;
	emitter->cbopaque = cbopaque;
	emitter->item_at_depth = false;
	emitter->emitted_key = false;
	emitter->nesting_depth = 0;
}